

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O0

void __thiscall CGraphics_Threaded::CGraphics_Threaded(CGraphics_Threaded *this)

{
  IEngineGraphics *in_RDI;
  
  IEngineGraphics::IEngineGraphics(in_RDI);
  (in_RDI->super_IGraphics).super_IInterface._vptr_IInterface =
       (_func_int **)&PTR__CGraphics_Threaded_00297390;
  IGraphics::CTextureHandle::CTextureHandle
            ((CTextureHandle *)&in_RDI[0x733d].super_IGraphics.m_DesktopScreenHeight);
  in_RDI[1].super_IGraphics.m_ScreenHeight = 0;
  in_RDI[1].super_IGraphics.m_DesktopScreenWidth = 0;
  in_RDI[1].super_IGraphics.m_DesktopScreenHeight = 0;
  in_RDI[1].super_IGraphics.m_ScreenHiDPIScale = 0.0;
  in_RDI[1].super_IGraphics.field_0x24 = 0;
  *(undefined4 *)&in_RDI[2].super_IGraphics.super_IInterface._vptr_IInterface = 0;
  *(undefined4 *)((long)&in_RDI[2].super_IGraphics.super_IInterface._vptr_IInterface + 4) = 0;
  *(undefined4 *)&in_RDI[2].super_IGraphics.super_IInterface.m_pKernel = 0;
  *(undefined4 *)((long)&in_RDI[2].super_IGraphics.super_IInterface.m_pKernel + 4) = 0;
  *(undefined4 *)&in_RDI[1].super_IGraphics.super_IInterface.m_pKernel = 0xffffffff;
  *(undefined4 *)&(in_RDI->super_IGraphics).field_0x24 = 0;
  *(undefined4 *)&in_RDI[1].super_IGraphics.super_IInterface._vptr_IInterface = 0;
  *(undefined4 *)((long)&in_RDI[1].super_IGraphics.super_IInterface._vptr_IInterface + 4) = 0;
  *(undefined4 *)&in_RDI[3].super_IGraphics.super_IInterface.m_pKernel = 0;
  in_RDI[3].super_IGraphics.super_IInterface._vptr_IInterface = (_func_int **)0x0;
  in_RDI[2].super_IGraphics.m_DesktopScreenWidth = 0;
  in_RDI[2].super_IGraphics.m_DesktopScreenHeight = 0;
  *(undefined8 *)&in_RDI[2].super_IGraphics.m_ScreenHiDPIScale = 0;
  *(undefined4 *)&in_RDI[0x7337].super_IGraphics.super_IInterface.m_pKernel = 0;
  (in_RDI->super_IGraphics).m_ScreenWidth = -1;
  (in_RDI->super_IGraphics).m_ScreenHeight = -1;
  *(undefined4 *)&in_RDI[0x733a].super_IGraphics.super_IInterface.m_pKernel = 0;
  *(undefined4 *)((long)&in_RDI[0x733a].super_IGraphics.super_IInterface.m_pKernel + 4) = 0;
  in_RDI[0x74d7].super_IGraphics.m_DesktopScreenWidth = 0;
  *(undefined1 *)((long)&in_RDI[0x733a].super_IGraphics.super_IInterface._vptr_IInterface + 4) = 1;
  *(undefined1 *)&in_RDI[0x733a].super_IGraphics.m_ScreenWidth = 0;
  return;
}

Assistant:

CGraphics_Threaded::CGraphics_Threaded()
{
	m_State.m_ScreenTL.x = 0;
	m_State.m_ScreenTL.y = 0;
	m_State.m_ScreenBR.x = 0;
	m_State.m_ScreenBR.y = 0;
	m_State.m_ClipEnable = false;
	m_State.m_ClipX = 0;
	m_State.m_ClipY = 0;
	m_State.m_ClipW = 0;
	m_State.m_ClipH = 0;
	m_State.m_Texture = -1;
	m_State.m_BlendMode = CCommandBuffer::BLEND_NONE;
	m_State.m_WrapModeU = WRAP_REPEAT;
	m_State.m_WrapModeV = WRAP_REPEAT;

	m_CurrentCommandBuffer = 0;
	m_pCommandBuffer = 0x0;
	m_apCommandBuffers[0] = 0x0;
	m_apCommandBuffers[1] = 0x0;

	m_NumVertices = 0;

	m_ScreenWidth = -1;
	m_ScreenHeight = -1;

	m_Rotation = 0;
	m_Drawing = 0;

	m_TextureMemoryUsage = 0;

	m_RenderEnable = true;
	m_DoScreenshot = false;
}